

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::TestEventListenerBase>::testGroupStarting
          (StreamingReporterBase<Catch::TestEventListenerBase> *this,GroupInfo *_groupInfo)

{
  GroupInfo *_groupInfo_local;
  StreamingReporterBase<Catch::TestEventListenerBase> *this_local;
  
  LazyStat<Catch::GroupInfo>::operator=(&this->currentGroupInfo,_groupInfo);
  return;
}

Assistant:

void testGroupStarting(GroupInfo const& _groupInfo) override {
            currentGroupInfo = _groupInfo;
        }